

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  BYTE *s;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  size_t sVar12;
  byte *pbVar13;
  ulong uVar14;
  BYTE *d_1;
  byte *pbVar15;
  byte *pbVar16;
  long lVar17;
  ulong uVar18;
  BYTE *d;
  byte *pbVar19;
  ushort *puVar20;
  ushort *puVar21;
  int local_50;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar17 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar17 = 0;
  }
  if (originalSize == 0) {
    return -(uint)(*source != '\0') | 1;
  }
  pbVar1 = (byte *)(dest + originalSize);
  local_50 = (int)source;
  pbVar19 = (byte *)dest;
  if (originalSize < 0x40) goto LAB_001c6efa;
LAB_001c6bdb:
  while( true ) {
    bVar3 = (byte)*(ushort *)source;
    uVar11 = (uint)bVar3;
    uVar7 = (uint)(bVar3 >> 4);
    if (uVar7 == 0xf) {
      uVar7 = 0;
      puVar21 = (ushort *)((long)source + 0x10);
      do {
        puVar20 = puVar21;
        uVar7 = uVar7 + *(byte *)((long)puVar20 + -0xf);
        puVar21 = (ushort *)((long)puVar20 + 1);
      } while (*(byte *)((long)puVar20 + -0xf) == 0xff);
      uVar14 = (ulong)uVar7;
      pbVar15 = pbVar19 + uVar14 + 0xf;
      if (dest + (long)originalSize + -8 < pbVar15) {
        sVar12 = uVar14 + 0xf;
        source = (char *)(puVar20 + -7);
        goto LAB_001c6f35;
      }
      puVar21 = puVar20 + -7;
      do {
        *(undefined8 *)pbVar19 = *(undefined8 *)puVar21;
        pbVar19 = pbVar19 + 8;
        puVar21 = puVar21 + 4;
      } while (pbVar19 < pbVar15);
      puVar21 = (ushort *)((long)puVar20 + 1 + uVar14);
    }
    else {
      *(undefined8 *)pbVar19 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pbVar19 + 8) = *(undefined8 *)((long)source + 9);
      }
      pbVar15 = pbVar19 + uVar7;
      puVar21 = (ushort *)((byte *)((long)source + 1) + uVar7);
    }
    uVar4 = *puVar21;
    uVar14 = (ulong)uVar4;
    source = (char *)(puVar21 + 1);
    pbVar9 = pbVar15 + -uVar14;
    uVar18 = (ulong)(bVar3 & 0xf);
    if (uVar18 == 0xf) break;
    sVar12 = uVar18 + 4;
    if (pbVar1 + -0x40 <= pbVar15 + uVar18 + 4) goto LAB_001c6f8e;
    if ((pbVar9 < dest) || (uVar4 < 8)) goto LAB_001c6c9c;
    *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
    *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)(pbVar9 + 8);
    *(undefined2 *)(pbVar15 + 0x10) = *(undefined2 *)(pbVar9 + 0x10);
    pbVar19 = pbVar15 + uVar18 + 4;
  }
  uVar7 = 0;
  do {
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar7 = uVar7 + (byte)uVar6;
  } while ((byte)uVar6 == 0xff);
  sVar12 = (ulong)uVar7 + 0x13;
  if (pbVar1 + -0x40 <= pbVar15 + (ulong)uVar7 + 0x13) goto LAB_001c6f8e;
LAB_001c6c9c:
  pbVar2 = pbVar15 + sVar12;
  pbVar19 = pbVar2;
  if (dest <= pbVar9) {
    if (0xf < uVar4) {
      do {
        uVar5 = *(undefined8 *)(pbVar15 + -uVar14 + 8);
        *(undefined8 *)pbVar15 = *(undefined8 *)(pbVar15 + -uVar14);
        *(undefined8 *)(pbVar15 + 8) = uVar5;
        uVar5 = *(undefined8 *)(pbVar15 + -uVar14 + 0x10 + 8);
        *(undefined8 *)(pbVar15 + 0x10) = *(undefined8 *)(pbVar15 + -uVar14 + 0x10);
        *(undefined8 *)(pbVar15 + 0x18) = uVar5;
        pbVar15 = pbVar15 + 0x20;
      } while (pbVar15 < pbVar2);
      goto LAB_001c6bdb;
    }
    if (uVar14 == 4) {
      iVar8 = *(int *)pbVar9;
    }
    else if (uVar4 == 2) {
      iVar8 = CONCAT22(*(undefined2 *)pbVar9,*(undefined2 *)pbVar9);
    }
    else {
      if (uVar4 != 1) {
        if (uVar4 < 8) {
          pbVar15[0] = 0;
          pbVar15[1] = 0;
          pbVar15[2] = 0;
          pbVar15[3] = 0;
          *pbVar15 = *pbVar9;
          pbVar15[1] = pbVar9[1];
          pbVar15[2] = pbVar9[2];
          pbVar15[3] = pbVar9[3];
          uVar7 = inc32table[uVar4];
          *(undefined4 *)(pbVar15 + 4) = *(undefined4 *)(pbVar9 + uVar7);
          pbVar9 = pbVar9 + ((ulong)uVar7 - (long)dec64table[uVar4]);
        }
        else {
          *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
          pbVar9 = pbVar9 + 8;
        }
        pbVar15 = pbVar15 + 8;
        do {
          *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
          pbVar15 = pbVar15 + 8;
          pbVar9 = pbVar9 + 8;
        } while (pbVar15 < pbVar2);
        goto LAB_001c6bdb;
      }
      iVar8 = (uint)*pbVar9 * 0x1010101;
    }
    do {
      *(int *)pbVar15 = iVar8;
      *(int *)(pbVar15 + 4) = iVar8;
      pbVar15 = pbVar15 + 8;
    } while (pbVar15 < pbVar2);
    goto LAB_001c6bdb;
  }
  if (pbVar2 <= pbVar1 + -5) {
    uVar18 = (long)dest - (long)pbVar9;
    uVar14 = sVar12 - uVar18;
    if (sVar12 < uVar18 || uVar14 == 0) {
      memmove(pbVar15,(void *)(lVar17 - uVar18),sVar12);
    }
    else {
      memcpy(pbVar15,(void *)(lVar17 - uVar18),uVar18);
      pbVar19 = pbVar15 + uVar18;
      pbVar15 = (byte *)dest;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar14) {
        for (; pbVar19 < pbVar2; pbVar19 = pbVar19 + 1) {
          *pbVar19 = *pbVar15;
          pbVar15 = pbVar15 + 1;
        }
      }
      else {
        memcpy(pbVar19,dest,uVar14);
        pbVar19 = pbVar2;
      }
    }
    goto LAB_001c6bdb;
  }
LAB_001c7094:
  return ~(uint)source + local_50;
LAB_001c6f8e:
  pbVar2 = pbVar15 + sVar12;
  pbVar19 = pbVar2;
  if (pbVar9 < dest) {
    if (pbVar1 + -5 < pbVar2) goto LAB_001c7094;
    uVar18 = (long)dest - (long)pbVar9;
    uVar14 = sVar12 - uVar18;
    if (sVar12 < uVar18 || uVar14 == 0) {
      memmove(pbVar15,(void *)(lVar17 - uVar18),sVar12);
    }
    else {
      memcpy(pbVar15,(void *)(lVar17 - uVar18),uVar18);
      pbVar19 = pbVar15 + uVar18;
      pbVar15 = (byte *)dest;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar14) {
        for (; pbVar19 < pbVar2; pbVar19 = pbVar19 + 1) {
          *pbVar19 = *pbVar15;
          pbVar15 = pbVar15 + 1;
        }
      }
      else {
        memcpy(pbVar19,dest,uVar14);
        pbVar19 = pbVar2;
      }
    }
  }
  else {
    if ((uint)uVar14 < 8) {
      pbVar15[0] = 0;
      pbVar15[1] = 0;
      pbVar15[2] = 0;
      pbVar15[3] = 0;
      *pbVar15 = *pbVar9;
      pbVar15[1] = pbVar9[1];
      pbVar15[2] = pbVar9[2];
      pbVar15[3] = pbVar9[3];
      uVar14 = (ulong)((uint)uVar14 << 2);
      uVar18 = (ulong)*(uint *)((long)inc32table + uVar14);
      *(undefined4 *)(pbVar15 + 4) = *(undefined4 *)(pbVar9 + uVar18);
      pbVar9 = pbVar9 + (uVar18 - (long)*(int *)((long)dec64table + uVar14));
    }
    else {
      *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
      pbVar9 = pbVar9 + 8;
    }
    pbVar10 = pbVar15 + 8;
    if (pbVar1 + -0xc < pbVar2) {
      if (pbVar1 + -5 < pbVar2) goto LAB_001c7094;
      pbVar15 = pbVar1 + -7;
      pbVar13 = pbVar9;
      pbVar16 = pbVar10;
      if (pbVar10 < pbVar15) {
        do {
          *(undefined8 *)pbVar16 = *(undefined8 *)pbVar13;
          pbVar16 = pbVar16 + 8;
          pbVar13 = pbVar13 + 8;
        } while (pbVar16 < pbVar15);
        pbVar9 = pbVar9 + ((long)pbVar15 - (long)pbVar10);
        pbVar10 = pbVar15;
      }
      for (; pbVar10 < pbVar2; pbVar10 = pbVar10 + 1) {
        bVar3 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        *pbVar10 = bVar3;
      }
    }
    else {
      *(undefined8 *)pbVar10 = *(undefined8 *)pbVar9;
      if (0x10 < sVar12) {
        pbVar15 = pbVar15 + 0x10;
        do {
          pbVar9 = pbVar9 + 8;
          *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
          pbVar15 = pbVar15 + 8;
        } while (pbVar15 < pbVar2);
      }
    }
  }
LAB_001c6efa:
  while( true ) {
    uVar4 = *(ushort *)source;
    uVar11 = (uint)(byte)uVar4;
    source = (char *)((long)source + 1);
    uVar7 = (uint)(byte)((byte)uVar4 >> 4);
    sVar12 = (size_t)uVar7;
    if ((0x8f < uVar11) || (dest + (long)originalSize + -0x1a < pbVar19)) break;
    *(undefined8 *)pbVar19 = *(undefined8 *)source;
    pbVar15 = pbVar19 + sVar12;
    uVar18 = (ulong)(uVar11 & 0xf);
    puVar21 = (ushort *)((long)source + sVar12);
    source = (char *)(puVar21 + 1);
    uVar4 = *puVar21;
    uVar14 = (ulong)uVar4;
    pbVar9 = pbVar15 + -uVar14;
    if (((uVar18 == 0xf) || (uVar4 < 8)) || (pbVar9 < dest)) goto LAB_001c6f6c;
    *(undefined8 *)pbVar15 = *(undefined8 *)pbVar9;
    *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)(pbVar9 + 8);
    *(undefined2 *)(pbVar15 + 0x10) = *(undefined2 *)(pbVar9 + 0x10);
    pbVar19 = pbVar15 + uVar18 + 4;
  }
  if (uVar7 == 0xf) {
    uVar7 = 0;
    do {
      uVar4 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar7 = uVar7 + (byte)uVar4;
    } while ((byte)uVar4 == 0xff);
    sVar12 = (ulong)uVar7 + 0xf;
  }
  pbVar15 = pbVar19 + sVar12;
LAB_001c6f35:
  puVar21 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pbVar15) goto LAB_001c708f;
  do {
    *(undefined8 *)pbVar19 = *(undefined8 *)puVar21;
    pbVar19 = pbVar19 + 8;
    puVar21 = puVar21 + 4;
  } while (pbVar19 < pbVar15);
  puVar21 = (ushort *)((long)source + sVar12);
  source = (char *)(puVar21 + 1);
  uVar14 = (ulong)*puVar21;
  pbVar9 = pbVar15 + -uVar14;
  uVar18 = (ulong)(uVar11 & 0xf);
LAB_001c6f6c:
  if ((int)uVar18 == 0xf) {
    uVar7 = 0;
    do {
      uVar4 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar7 = uVar7 + (byte)uVar4;
    } while ((byte)uVar4 == 0xff);
    uVar18 = (ulong)uVar7 + 0xf;
  }
  sVar12 = uVar18 + 4;
  goto LAB_001c6f8e;
LAB_001c708f:
  if (pbVar15 == pbVar1) {
    memmove(pbVar19,source,sVar12);
    return ((int)source + (int)sVar12) - local_50;
  }
  goto LAB_001c7094;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}